

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int sk_addrtype(SockAddr *addr)

{
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int family;
  SockAddrStep step;
  SockAddr *addr_local;
  
  if (addr->superfamily == UNRESOLVED) {
    local_28 = 0;
  }
  else {
    if (addr->superfamily == UNIX) {
      local_2c = 1;
    }
    else {
      if (addr->ais == (addrinfo *)0x0) {
        local_30 = 2;
      }
      else {
        local_30 = addr->ais->ai_family;
      }
      local_2c = local_30;
    }
    local_28 = local_2c;
  }
  if (local_28 == 2) {
    local_34 = 1;
  }
  else {
    local_34 = 4;
    if (local_28 == 10) {
      local_34 = 2;
    }
  }
  return local_34;
}

Assistant:

int sk_addrtype(SockAddr *addr)
{
    SockAddrStep step;
    int family;
    START_STEP(addr, step);
    family = SOCKADDR_FAMILY(addr, step);

    return (family == AF_INET ? ADDRTYPE_IPV4 :
#ifndef NO_IPV6
            family == AF_INET6 ? ADDRTYPE_IPV6 :
#endif
            ADDRTYPE_NAME);
}